

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O2

int __thiscall
OpenAmulet::Map<int,_int,_std::less<int>_>::GetAt(Map<int,_int,_std::less<int>_> *this,int *aKey)

{
  const_iterator cVar1;
  int *piVar2;
  
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)this,aKey);
  piVar2 = &this->mDefaultReturn;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->mMap)._M_t._M_impl.super__Rb_tree_header) {
    piVar2 = (int *)&cVar1._M_node[1].field_0x4;
  }
  return *piVar2;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }